

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O2

void __thiscall BayesianGameForDecPOMDPStage::Initialize(BayesianGameForDecPOMDPStage *this)

{
  int *piVar1;
  BayesianGameIdenticalPayoff *this_00;
  uint *__last;
  uint ts;
  element_type *peVar2;
  sp_counted_base *psVar3;
  PlanningUnitDecPOMDPDiscrete *pPVar4;
  long lVar5;
  QFunctionJAOHInterface *pQVar6;
  code *pcVar7;
  RewardModelDiscreteInterface *pRVar8;
  _func_int *p_Var9;
  undefined8 uVar10;
  bool bVar11;
  long *plVar12;
  JointBeliefInterface *pJVar13;
  Index *pIVar14;
  char cVar15;
  size_t sVar16;
  ostream *poVar17;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  reference ppJVar18;
  size_t sVar19;
  E *this_01;
  ulong uVar20;
  Index *jaI_arr;
  Index IVar21;
  uint jTypeI;
  Index jaI;
  Index *pIVar22;
  ulong uVar23;
  Index aIStack_120 [2];
  LIndex LStack_118;
  Index aIStack_110 [4];
  undefined1 local_100 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> indTypes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> jaI_vec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> joI_vec;
  shared_ptr<const_JointPolicyDiscretePure> local_98;
  undefined1 auStack_88 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> firstOHtsI;
  shared_count sStack_60;
  JointBeliefInterface *local_58;
  ulong local_50;
  Index local_44;
  Index *local_40;
  allocator_type local_31;
  
  peVar2 = (this->super_BayesianGameForDecPOMDPStageInterface)._m_pJPol.px;
  ts = (this->super_BayesianGameForDecPOMDPStageInterface)._m_t;
  firstOHtsI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(this->super_BayesianGameForDecPOMDPStageInterface)._m_pJPol.pn.pi_;
  if ((sp_counted_base *)
      firstOHtsI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (sp_counted_base *)0x0) {
    LOCK();
    ((sp_counted_base *)
    firstOHtsI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start)->use_count_ =
         ((sp_counted_base *)
         firstOHtsI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start)->use_count_ + 1;
    UNLOCK();
  }
  auStack_88 = (undefined1  [8])peVar2;
  boost::detail::shared_count::~shared_count((shared_count *)&firstOHtsI);
  if (peVar2 == (element_type *)0x0) {
    poVar17 = std::operator<<((ostream *)&std::cerr,
                              "Warning Initialize called without past joint policy: aborting.");
    std::endl<char,std::char_traits<char>>(poVar17);
  }
  else {
    sVar16 = PlanningUnitMADPDiscrete::GetNrJointObservationHistories
                       (&this->_m_pu->super_PlanningUnitMADPDiscrete,ts);
    peVar2 = (this->super_BayesianGameForDecPOMDPStageInterface)._m_pJPol.px;
    sStack_60.pi_ = (this->super_BayesianGameForDecPOMDPStageInterface)._m_pJPol.pn.pi_;
    psVar3 = (this->super_BayesianGameForDecPOMDPStageInterface)._m_pJPol.pn.pi_;
    if (psVar3 == (sp_counted_base *)0x0) {
      sStack_60.pi_ = (sp_counted_base *)0x0;
    }
    else {
      LOCK();
      piVar1 = &psVar3->use_count_;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    _auStack_88 = (undefined1  [16])0x0;
    boost::detail::shared_count::~shared_count((shared_count *)&firstOHtsI);
    firstOHtsI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    _auStack_88 = (undefined1  [16])0x0;
    Fill_FirstOHtsI(this,ts,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_88);
    this_00 = &this->super_BayesianGameIdenticalPayoff;
    jTypeI = 0;
    uVar20 = (ulong)ts * 4 + 0xf & 0xfffffffffffffff0;
    local_50 = (ulong)ts;
    while( true ) {
      if (sVar16 <= jTypeI) break;
      __x = BayesianGameBase::JointToIndividualTypeIndices((BayesianGameBase *)this_00,jTypeI);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100,__x);
      uVar23 = local_50;
      lVar5 = -uVar20;
      pIVar22 = (Index *)((long)aIStack_110 + lVar5 + 8);
      *(undefined8 *)((long)aIStack_110 + lVar5) = 0x3f548e;
      Fill_joI_Array(this,(Index)uVar23,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_88,pIVar22);
      uVar23 = local_50;
      jaI_arr = (Index *)((long)pIVar22 - uVar20);
      local_98.pn.pi_ = sStack_60.pi_;
      if (sStack_60.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (sStack_60.pi_)->use_count_ = (sStack_60.pi_)->use_count_ + 1;
        UNLOCK();
      }
      local_98.px = &peVar2->super_JointPolicyDiscretePure;
      local_40 = jaI_arr;
      jaI_arr[-2] = 0x3f54cb;
      jaI_arr[-1] = 0;
      Fill_jaI_Array(this,(Index)uVar23,pIVar22,&local_98,jaI_arr);
      jaI_arr[-2] = 0x3f54d7;
      jaI_arr[-1] = 0;
      boost::detail::shared_count::~shared_count(&local_98.pn);
      pPVar4 = this->_m_pu;
      jaI_arr[-2] = 0x3f54e3;
      jaI_arr[-1] = 0;
      local_58 = PlanningUnitMADPDiscrete::GetNewJointBeliefFromISD
                           (&pPVar4->super_PlanningUnitMADPDiscrete);
      pIVar14 = local_40;
      uVar23 = local_50;
      if (local_50 == 0) {
        local_44 = 0;
        local_40 = (Index *)0x3ff0000000000000;
LAB_003f55b7:
        pJVar13 = local_58;
        lVar5 = *(long *)((long)*local_58 + -0xb8);
        plVar12 = (long *)&local_58->field_0x0;
        pcVar7 = *(code **)(*(long *)((long)&local_58->field_0x0 + lVar5) + 0x78);
        jaI_arr[-2] = 0x3f55d2;
        jaI_arr[-1] = 0;
        cVar15 = (*pcVar7)((long)plVar12 + lVar5);
        if (cVar15 == '\0') {
          jaI_arr[-2] = 0x28;
          jaI_arr[-1] = 0;
          uVar10 = *(undefined8 *)(jaI_arr + -2);
          jaI_arr[-2] = 0x3f56a2;
          jaI_arr[-1] = 0;
          this_01 = (E *)__cxa_allocate_exception(uVar10);
          jaI_arr[-2] = 0x3f56b4;
          jaI_arr[-1] = 0;
          E::E(this_01,"BayesianGameForDecPOMDPStage::Initialize() joint belief not valid");
          *(undefined1 **)(jaI_arr + -2) = &LAB_003f56ca;
          __cxa_throw(this_01,&E::typeinfo,E::~E);
        }
        jaI_arr[-2] = 0x3f55e9;
        jaI_arr[-1] = 0;
        ppJVar18 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::at
                             (&this->_m_JBs,(ulong)jTypeI);
        bVar11 = true;
        *ppJVar18 = pJVar13;
      }
      else {
        __last = local_40 + local_50;
        jaI_arr[-2] = 0x3f550f;
        jaI_arr[-1] = 0;
        std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int*,void>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                   &indTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage,pIVar14,__last,
                   (allocator_type *)
                   &jaI_vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        jaI_arr[-2] = 0x3f5526;
        jaI_arr[-1] = 0;
        std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int*,void>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                   &jaI_vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,pIVar22,pIVar22 + uVar23,&local_31);
        pPVar4 = this->_m_pu;
        IVar21 = (Index)uVar23;
        jaI_arr[-2] = 0x3f5543;
        jaI_arr[-1] = 0;
        local_44 = PlanningUnitMADPDiscrete::GetJointActionObservationHistoryIndex
                             (&pPVar4->super_PlanningUnitMADPDiscrete,IVar21,
                              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              &indTypes.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              &jaI_vec.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
        pPVar4 = this->_m_pu;
        jaI_arr[-4] = 0;
        jaI_arr[-3] = 0;
        jaI_arr[-2] = 0;
        pIVar14 = local_40;
        pJVar13 = local_58;
        jaI_arr[-1] = 0;
        jaI_arr[-6] = 0x3f5570;
        jaI_arr[-5] = 0;
        local_40 = (Index *)PlanningUnitMADPDiscrete::GetJAOHProbsRecursively
                                      (&pPVar4->super_PlanningUnitMADPDiscrete,pJVar13,pIVar14,
                                       pIVar22,0,IVar21,*(LIndex *)(jaI_arr + -4),
                                       *(JointPolicyDiscrete **)(jaI_arr + -2));
        jaI_arr[-2] = 0x3f5583;
        jaI_arr[-1] = 0;
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &jaI_vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        jaI_arr[-2] = 0x3f558f;
        jaI_arr[-1] = 0;
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &indTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage);
        if (0.0 < (double)local_40) goto LAB_003f55b7;
        bVar11 = false;
      }
      pIVar22 = local_40;
      jaI_arr[-2] = 0x3f55ff;
      jaI_arr[-1] = 0;
      BayesianGameBase::SetProbability((BayesianGameBase *)this_00,jTypeI,(double)pIVar22);
      uVar23 = 0;
      while( true ) {
        jaI_arr[-2] = 0x3f560a;
        jaI_arr[-1] = 0;
        sVar19 = BayesianGameBase::GetNrJointActions((BayesianGameBase *)this_00);
        IVar21 = local_44;
        if (sVar19 <= uVar23) break;
        if (bVar11) {
          pQVar6 = this->_m_qHeuristic;
          pcVar7 = *(code **)((long)*pQVar6 + 0x68);
          jaI_arr[-2] = 0x3f562a;
          jaI_arr[-1] = 0;
          (*pcVar7)(pQVar6,IVar21,uVar23);
          pRVar8 = (this->super_BayesianGameIdenticalPayoff)._m_utilFunction;
          p_Var9 = (pRVar8->super_QTableInterface)._vptr_QTableInterface[1];
          jaI_arr[-2] = 0x3f563d;
          jaI_arr[-1] = 0;
          (*p_Var9)(pRVar8,(ulong)jTypeI,uVar23);
        }
        else {
          pRVar8 = (this->super_BayesianGameIdenticalPayoff)._m_utilFunction;
          p_Var9 = (pRVar8->super_QTableInterface)._vptr_QTableInterface[1];
          jaI_arr[-2] = 0x3f5656;
          jaI_arr[-1] = 0;
          (*p_Var9)(0,pRVar8,(ulong)jTypeI,uVar23);
        }
        uVar23 = (ulong)((int)uVar23 + 1);
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_100);
      jTypeI = jTypeI + 1;
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_88);
    boost::detail::shared_count::~shared_count(&sStack_60);
  }
  return;
}

Assistant:

void BayesianGameForDecPOMDPStage::Initialize()
{
    //stringstream ss;
    //ss << "GMAA::ConstructBG_ts" << depth;
    //_m_pu->StartTimer(ss.str());

    Index ts = GetStage();
    if(GetPastJointPolicy() == 0)
    {
        cerr << "Warning Initialize called without past joint policy: aborting."
            <<endl;
        return;
    }

    if(DEBUG_BG4DECPOMDP1)
        cout << ">>>BayesianGameForDecPOMDPStage::Initialize() called for"
             << " ts=" << ts << endl;
    if(DEBUG_BG4DECPOMDP2)
        cout <<" - previous policy: " << GetPastJointPolicy()->SoftPrintBrief() << endl;

    size_t nrJOHts = _m_pu->GetNrJointObservationHistories(ts);
    boost::shared_ptr<const JointPolicyDiscretePure> jpolPrevTs = GetPastJointPolicy();

    //stores the indices of the first OH for time step ts for each agent
    vector<Index> firstOHtsI;
    Fill_FirstOHtsI(ts, firstOHtsI);
    
    //the expected reward for time-steps 0...ts-1
    //this will be calculated as Sum_jaoh P(jaoh) R_{0...ts-1}(jaoh)
    //double ExpR_0_prevTS = 0.0;


    BayesianGameIdenticalPayoff *bg_ts=this;
    //for each joint obs. history (type of the BG), we determine the actions
    //that jpolPrevTs would have specified (i.e., we determine JAOH, the 
    //act-obs. history). This is then used to compute:
    //  -the probability of this joint obs. history (given jpolPrevTs)
    //  -the expected reward over 0...ts-1 GIVEN that this JAOH occurs
    for(Index jtI = 0; jtI < nrJOHts; jtI++)
    {
        if(DEBUG_BG4DECPOMDP2)
            PrintProgress("jtI",jtI,nrJOHts, 10);
        
        //we loop over Joint Type indices - these correspond to 
        //joint observation history indices, but non-trivially, so let's first
        //compute the joint observation history 
        const vector<Index> indTypes = bg_ts->JointToIndividualTypeIndices(jtI);

        //array for the joint observations at ts=1,...,ts
        Index joI_arr[ts];
        Fill_joI_Array(ts, indTypes, firstOHtsI, joI_arr);

        //we don't want to be dependent on the generation of joint
        //observation histories
        //const JointObservationHistoryTree* joht = Get_joht(ts, joI_arr);
        //Index johI = _m_pu->GetJointObservationHistoryIndex(ts, joI_arr);

        //see what joint action-observation history corresponds to 
        // previous policy jpolPrevTs

        //first get all actions taken
        Index jaI_arr[ts];//the taken joint actions at t=0,...,ts-1
        Fill_jaI_Array(ts, joI_arr, jpolPrevTs, jaI_arr);
        //now we know the taken actions and the observation history, so we 
        //can reconstruct the joint action-observation history and its 
        //probability.

        //the cumulative reward over 0...ts-1 GIVEN that this JAOH occurs.
        //double ExpR_0_prevTS_thisJAOH = 0.0;
        //get the joah Index and corresponding reward and prob.
        //new:
        Index jaohI = 0;
        double PjaohI = 1.0;
        JointBeliefInterface* jb = _m_pu->GetNewJointBeliefFromISD();
        if(ts > 0)
        {
            vector< Index > jaI_vec(&jaI_arr[0],&jaI_arr[ts]);
            vector< Index > joI_vec(&joI_arr[0],&joI_arr[ts]);
            jaohI = _m_pu->GetJointActionObservationHistoryIndex(ts, jaI_vec, 
                    joI_vec);
            PjaohI = _m_pu->GetJAOHProbsRecursively(jb, jaI_arr, joI_arr, 0,ts);
        }
        if(PjaohI>0)
        {
            if(jb->SanityCheck())
                _m_JBs.at(jtI) = jb;
            else
                throw(E("BayesianGameForDecPOMDPStage::Initialize() joint belief not valid"));
        }

/*        //old:
        ProbRewardForjoahI(ts, jtI, jaI_arr,joI_arr, jaohI, PjaohI, 
              ExpR_0_prevTS_thisJAOH );
        ExpR_0_prevTS += ExpR_0_prevTS_thisJAOH * PjaohI;
*/

        //now we have found the jaohI corresponding to johI (jtI) and 
        //previous policy jpolPrevTs, so we can get the Q-value and prob. for 
        //the BG.
        bg_ts->SetProbability(jtI, PjaohI);
        for(Index jaI=0; jaI < GetNrJointActions(); jaI++)
        {
            if(PjaohI>0) // asking for a heuristic Q for a history
                         // that cannot have occurred might lead to
                         // problems (QMDP cannot compute a belief for
                         // instance, so just put 0
            {
                double ut = _m_qHeuristic->GetQ(jaohI, jaI);
                bg_ts->SetUtility(jtI, jaI, ut );
            }
            else
                bg_ts->SetUtility(jtI, jaI, 0);
        }
    
    }//end for jtI
    //now the Bayesian game is constructed completely.

    //perhaps store the previous reward somewhere?
    //_m_pastReward = ExpR_0_prevTS;
}